

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resourcefile.cpp
# Opt level: O1

int __thiscall
FResourceFile::FilterLumps
          (FResourceFile *this,FString *filtername,void *lumps,size_t lumpsize,DWORD max)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  FString *pFVar4;
  void *pvVar5;
  FResourceFile *this_00;
  uint uVar6;
  undefined8 *pos;
  ulong uVar7;
  void *__dest;
  DWORD end;
  DWORD start;
  FString filter;
  uint local_68;
  uint local_64;
  FString local_60;
  void *local_58;
  long local_50;
  FResourceFile *local_48;
  FString local_40;
  FString local_38;
  
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  local_60.Chars = FString::NullString.Nothing;
  if (*(int *)(filtername->Chars + -0xc) == 0) {
    iVar3 = 0;
  }
  else {
    pFVar4 = FString::operator+=(&local_60,"filter/");
    pFVar4 = FString::operator+=(pFVar4,filtername);
    FString::operator+=(pFVar4,'/');
    this_00 = (FResourceFile *)&local_38;
    FString::AttachToOther((FString *)this_00,&local_60);
    bVar2 = FindPrefixRange(this_00,&local_38,lumps,lumpsize,max,&local_64,&local_68);
    FString::~FString(&local_38);
    if (bVar2) {
      uVar7 = (ulong)local_64;
      local_50 = uVar7 * lumpsize;
      local_58 = lumps;
      local_48 = this;
      if (local_64 < local_68) {
        pos = (undefined8 *)((long)lumps + local_50 + 0x10);
        do {
          uVar6 = ((FNullStringData *)(local_60.Chars + -0xc))->Len;
          iVar3 = strncasecmp((char *)*pos,local_60.Chars,(long)(int)uVar6);
          if (iVar3 != 0) {
            __assert_fail("lump->FullName.CompareNoCase(filter, (int)filter.Len()) == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/resourcefiles/resourcefile.cpp"
                          ,0x188,"int FResourceFile::FilterLumps(FString, void *, size_t, DWORD)");
          }
          FString::Mid(&local_40,(size_t)pos,(ulong)uVar6);
          FResourceLump::LumpNameSetup((FResourceLump *)(pos + -2),&local_40);
          FString::~FString(&local_40);
          uVar6 = (int)uVar7 + 1;
          uVar7 = (ulong)uVar6;
          pos = (undefined8 *)((long)pos + lumpsize);
        } while (uVar6 < local_68);
      }
      uVar1 = local_68;
      pvVar5 = (void *)(local_50 + (long)local_58);
      uVar7 = (local_68 - local_64) * lumpsize;
      uVar6 = local_48->NumLumps;
      __dest = (void *)((long)local_58 + (uVar6 * lumpsize - uVar7));
      if (__dest < pvVar5) {
        __assert_fail("to >= from",
                      "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/resourcefiles/resourcefile.cpp"
                      ,399,"int FResourceFile::FilterLumps(FString, void *, size_t, DWORD)");
      }
      if (__dest != pvVar5) {
        local_58 = operator_new__(uVar7);
        memcpy(local_58,pvVar5,uVar7);
        memmove(pvVar5,(void *)((long)pvVar5 + uVar7),(uVar6 - uVar1) * lumpsize);
        pvVar5 = local_58;
        memcpy(__dest,local_58,uVar7);
        operator_delete__(pvVar5);
      }
    }
    iVar3 = local_68 - local_64;
  }
  FString::~FString(&local_60);
  return iVar3;
}

Assistant:

int FResourceFile::FilterLumps(FString filtername, void *lumps, size_t lumpsize, DWORD max)
{
	FString filter;
	DWORD start, end;

	if (filtername.IsEmpty())
	{
		return 0;
	}
	filter << "filter/" << filtername << '/';
	if (FindPrefixRange(filter, lumps, lumpsize, max, start, end))
	{
		void *from = (BYTE *)lumps + start * lumpsize;

		// Remove filter prefix from every name
		void *lump_p = from;
		for (DWORD i = start; i < end; ++i, lump_p = (BYTE *)lump_p + lumpsize)
		{
			FResourceLump *lump = (FResourceLump *)lump_p;
			assert(lump->FullName.CompareNoCase(filter, (int)filter.Len()) == 0);
			lump->LumpNameSetup(lump->FullName.Mid(filter.Len()));
		}

		// Move filtered lumps to the end of the lump list.
		size_t count = (end - start) * lumpsize;
		void *to = (BYTE *)lumps + NumLumps * lumpsize - count;
		assert (to >= from);

		if (from != to)
		{
			// Copy filtered lumps to a temporary buffer.
			BYTE *filteredlumps = new BYTE[count];
			memcpy(filteredlumps, from, count);

			// Shift lumps left to make room for the filtered ones at the end.
			memmove(from, (BYTE *)from + count, (NumLumps - end) * lumpsize);

			// Copy temporary buffer to newly freed space.
			memcpy(to, filteredlumps, count);

			delete[] filteredlumps;
		}
	}
	return end - start;
}